

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedEofInputStream::pumpTo
          (DelayedEofInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  AsyncInputStream *pAVar1;
  Promise<unsigned_long> *in_RCX;
  Promise<unsigned_long> local_30;
  Promise<unsigned_long> *local_28;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  DelayedEofInputStream *this_local;
  
  local_28 = in_RCX;
  amount_local = amount;
  output_local = output;
  this_local = this;
  pAVar1 = Own<kj::AsyncInputStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncInputStream,_std::nullptr_t> *)(output + 1));
  (*pAVar1->_vptr_AsyncInputStream[3])(&local_30,pAVar1,amount_local,local_28);
  wrap<unsigned_long>(this,(unsigned_long)output,in_RCX);
  Promise<unsigned_long>::~Promise(&local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
      return wrap(amount, inner->pumpTo(output, amount));
    }